

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

void destStoreGray8(QRasterBuffer *rasterBuffer,int x,int y,uint *buffer,int length)

{
  uint uVar1;
  long lVar2;
  uchar *puVar3;
  bool bVar4;
  ulong uVar5;
  uint uVar6;
  long in_FS_OFFSET;
  QColorTransform tf;
  QColorSpace fromCS;
  QColorTransformPrivate *local_40;
  QColorSpace local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < length) {
    lVar2 = rasterBuffer->bytes_per_line;
    puVar3 = rasterBuffer->m_buffer;
    uVar5 = 0;
    do {
      uVar1 = buffer[uVar5];
      uVar6 = uVar1 >> 0x10 & 0xff;
      if ((uVar6 != (uVar1 >> 8 & 0xff)) || (uVar6 != (uVar1 & 0xff))) {
        local_38.d_ptr.d.ptr =
             (QExplicitlySharedDataPointer<QColorSpacePrivate>)&DAT_aaaaaaaaaaaaaaaa;
        bVar4 = QColorSpace::isValid(&rasterBuffer->colorSpace);
        if (bVar4) {
          QColorSpace::QColorSpace(&local_38,&rasterBuffer->colorSpace);
        }
        else {
          QColorSpace::QColorSpace(&local_38,SRgb);
        }
        local_40 = (QColorTransformPrivate *)&DAT_aaaaaaaaaaaaaaaa;
        QColorSpacePrivate::transformationToXYZ((QColorSpacePrivate *)&local_40);
        QColorTransformPrivate::apply<unsigned_char,unsigned_int>
                  (local_40,puVar3 + (long)x + y * lVar2,buffer,(ulong)(uint)length,
                   (TransformFlags)0x2);
        QColorTransform::~QColorTransform((QColorTransform *)&local_40);
        QColorSpace::~QColorSpace(&local_38);
        break;
      }
      (puVar3 + (long)x + y * lVar2)[uVar5] = (uchar)(uVar1 >> 0x10);
      uVar5 = uVar5 + 1;
    } while ((uint)length != uVar5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void QT_FASTCALL destStoreGray8(QRasterBuffer *rasterBuffer, int x, int y, const uint *buffer, int length)
{
    uchar *data = rasterBuffer->scanLine(y) + x;

    bool failed = false;
    for (int k = 0; k < length; ++k) {
        if (!qIsGray(buffer[k])) {
            failed = true;
            break;
        }
        data[k] = qRed(buffer[k]);
    }
    if (failed) { // Non-gray colors
        QColorSpace fromCS = rasterBuffer->colorSpace.isValid() ? rasterBuffer->colorSpace : QColorSpace::SRgb;
        QColorTransform tf = QColorSpacePrivate::get(fromCS)->transformationToXYZ();
        QColorTransformPrivate *tfd = QColorTransformPrivate::get(tf);

        tfd->apply(data, buffer, length, QColorTransformPrivate::InputPremultiplied);
    }
}